

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_ipoint.cpp
# Opt level: O2

int ON_2iVector::Compare(ON_2iVector *lhs,ON_2iVector *rhs)

{
  if (rhs->x <= lhs->x) {
    if (rhs->x < lhs->x) {
      return 1;
    }
    if (rhs->y <= lhs->y) {
      return (int)(rhs->y < lhs->y);
    }
  }
  return -1;
}

Assistant:

int ON_2iVector::Compare(
  const ON_2iVector& lhs,
  const ON_2iVector& rhs
)
{
  if (lhs.x < rhs.x)
    return -1;
  if (lhs.x > rhs.x)
    return 1;
  if (lhs.y < rhs.y)
    return -1;
  if (lhs.y > rhs.y)
    return 1;
  return 0;
}